

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void kahanBabuskaNeumaierStep(SumCtx *pSum,double r)

{
  double dVar1;
  double dVar2;
  double t;
  double s;
  double r_local;
  SumCtx *pSum_local;
  
  dVar1 = pSum->rSum;
  dVar2 = dVar1 + r;
  if (ABS(dVar1) <= ABS(r)) {
    pSum->rErr = pSum->rErr + (r - dVar2) + dVar1;
  }
  else {
    pSum->rErr = pSum->rErr + (dVar1 - dVar2) + r;
  }
  pSum->rSum = dVar2;
  return;
}

Assistant:

static void kahanBabuskaNeumaierStep(
  volatile SumCtx *pSum,
  volatile double r
){
  volatile double s = pSum->rSum;
  volatile double t = s + r;
  if( fabs(s) > fabs(r) ){
    pSum->rErr += (s - t) + r;
  }else{
    pSum->rErr += (r - t) + s;
  }
  pSum->rSum = t;
}